

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-client.c
# Opt level: O0

_Bool ssh2channel_send_signal(SshChannel *sc,_Bool want_reply,char *signame)

{
  ssh2_connection_state *psVar1;
  PktOut *pPVar2;
  code *handler;
  PktOut *pktout;
  ssh2_connection_state *s;
  ssh2_channel *c;
  char *signame_local;
  _Bool want_reply_local;
  SshChannel *sc_local;
  
  psVar1 = ((ssh2_channel *)(sc + -0xb))->connlayer;
  handler = (cr_handler_fn_t)0x0;
  if (want_reply) {
    handler = ssh2_channel_response;
  }
  pPVar2 = ssh2_chanreq_init((ssh2_channel *)(sc + -0xb),"signal",handler,(void *)0x0);
  BinarySink_put_stringz(pPVar2->binarysink_,signame);
  pq_base_push(&((psVar1->ppl).out_pq)->pqb,&pPVar2->qnode);
  return true;
}

Assistant:

bool ssh2channel_send_signal(
    SshChannel *sc, bool want_reply, const char *signame)
{
    struct ssh2_channel *c = container_of(sc, struct ssh2_channel, sc);
    struct ssh2_connection_state *s = c->connlayer;

    PktOut *pktout = ssh2_chanreq_init(
        c, "signal", want_reply ? ssh2_channel_response : NULL, NULL);
    put_stringz(pktout, signame);
    pq_push(s->ppl.out_pq, pktout);

    return true;
}